

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall Database::openDB(Database *this,string *fileName)

{
  int __val;
  char *filename;
  DatabaseException *this_00;
  ostream *this_01;
  __cxx11 local_60 [32];
  string local_40 [36];
  int local_1c;
  string *psStack_18;
  int failure;
  string *fileName_local;
  Database *this_local;
  
  psStack_18 = fileName;
  fileName_local = (string *)this;
  filename = (char *)std::__cxx11::string::c_str();
  local_1c = sqlite3_open_v2(filename,&this->database,0x10002,(char *)0x0);
  if (local_1c != 0) {
    this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
    __val = sqlite3_errcode(this->database);
    std::__cxx11::to_string(local_60,__val);
    std::operator+((char *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "SQLite error while opening database: ");
    DatabaseException::DatabaseException(this_00,local_40);
    __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
  }
  this_01 = std::operator<<((ostream *)&std::cout,"Database opened");
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Database::openDB(std::string fileName)
{
	int failure = sqlite3_open_v2(fileName.c_str(), &database, SQLITE_OPEN_FULLMUTEX | SQLITE_OPEN_READWRITE, nullptr);

	if(failure)
	{
		throw DatabaseException("SQLite error while opening database: " + std::to_string(sqlite3_errcode(database)));
	}
	else
	{
		std::cout << "Database opened" << std::endl;
	}
}